

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O0

float set_side_length(mixed_channel_t set,vbap_data *data)

{
  float (*a) [3];
  float (*b) [3];
  float (*b_00) [3];
  float fVar1;
  float fVar2;
  float fVar3;
  float length;
  float *k;
  float *j;
  float *i;
  float cross [3];
  vbap_data *data_local;
  mixed_channel_t set_local;
  
  a = data->speakers + data->sets[set].speakers[0];
  b = data->speakers + data->sets[set].speakers[1];
  b_00 = data->speakers + data->sets[set].speakers[2];
  cross._4_8_ = data;
  fVar1 = vec_angle(*a,*b);
  fVar2 = vec_angle(*a,*b_00);
  fVar3 = vec_angle(*b,*b_00);
  fVar1 = ABS(fVar1) + ABS(fVar2) + ABS(fVar3);
  vec_cross((float *)((long)&i + 4),*a,*b);
  if (fVar1 <= 1e-06) {
    data_local._4_4_ = 0.0;
  }
  else {
    fVar2 = vec_dot((float *)((long)&i + 4),*b_00);
    data_local._4_4_ = ABS(fVar2) / fVar1;
  }
  return data_local._4_4_;
}

Assistant:

float set_side_length(mixed_channel_t set, struct vbap_data *data){
  float cross[3];
  float *i = data->speakers[data->sets[set].speakers[0]];
  float *j = data->speakers[data->sets[set].speakers[1]];
  float *k = data->speakers[data->sets[set].speakers[2]];
  float length = fabsf(vec_angle(i, j))
                 + fabsf(vec_angle(i, k))
                 + fabsf(vec_angle(j, k));
  vec_cross(cross, i, j);
  if(0.000001 < length) return fabsf(vec_dot(cross, k)) / length;
  return 0.0;
}